

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::MakeTimestampNsFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *operator_set;
  allocator_type *in_stack_fffffffffffffd58;
  ScalarFunction *function;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffd60;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  LogicalType *local_238;
  LogicalType local_210 [24];
  undefined1 local_1f8 [32];
  LogicalType local_1d8 [32];
  LogicalType *local_1b8;
  LogicalType local_1b0 [24];
  LogicalType *local_198;
  undefined8 local_190;
  undefined1 local_188 [24];
  ScalarFunction local_170;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"make_timestamp_ns",&local_31);
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_1b8 = local_1b0;
  duckdb::LogicalType::LogicalType(local_1b8,BIGINT);
  local_198 = local_1b0;
  local_190 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xbf7458);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffd70;
  iVar1._M_array = (iterator)in_stack_fffffffffffffd68;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffd74;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffd60,iVar1,in_stack_fffffffffffffd58);
  duckdb::LogicalType::LogicalType(local_1d8,TIMESTAMP_NS);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_stack_fffffffffffffd68
            );
  duckdb::LogicalType::LogicalType(local_210,INVALID);
  this = (ScalarFunction *)0x0;
  function = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_170,local_188,local_1d8,local_1f8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function);
  ScalarFunction::~ScalarFunction(this);
  duckdb::LogicalType::~LogicalType(local_210);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xbf7556);
  duckdb::LogicalType::~LogicalType(local_1d8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xbf7570);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xbf757d);
  local_238 = (LogicalType *)&local_198;
  do {
    local_238 = local_238 + -0x18;
    duckdb::LogicalType::~LogicalType(local_238);
  } while (local_238 != local_1b0);
  return in_RDI;
}

Assistant:

ScalarFunctionSet MakeTimestampNsFun::GetFunctions() {
	ScalarFunctionSet operator_set("make_timestamp_ns");
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP_NS, ExecuteMakeTimestampNs<int64_t>));
	return operator_set;
}